

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O3

void duckdb::FixedSizeFetchRow<short>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  BufferManager *pBVar3;
  unsigned_long uVar4;
  BufferHandle handle;
  BufferHandle local_40;
  
  pBVar3 = BufferManager::GetBufferManager(segment->db);
  (*pBVar3->_vptr_BufferManager[7])(&local_40,pBVar3,&segment->block);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_40.node);
  pdVar1 = (local_40.node.ptr)->buffer;
  iVar2 = segment->offset;
  uVar4 = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  *(undefined2 *)(result->data + result_idx * 2) = *(undefined2 *)(pdVar1 + uVar4 * 2 + iVar2);
  BufferHandle::~BufferHandle(&local_40);
  return;
}

Assistant:

void FixedSizeFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                       idx_t result_idx) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);

	// first fetch the data from the base table
	auto data_ptr = handle.Ptr() + segment.GetBlockOffset() + NumericCast<idx_t>(row_id) * sizeof(T);

	memcpy(FlatVector::GetData(result) + result_idx * sizeof(T), data_ptr, sizeof(T));
}